

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

int Gia_IsoSort(Gia_IsoMan_t *p)

{
  uint nSize;
  uint Entry;
  word *pwVar1;
  Gia_Man_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  Vec_Int_t *t;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int Entry_00;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  long lVar14;
  timespec ts;
  timespec local_48;
  ulong local_38;
  
  iVar6 = 0;
  p->nSingles = 0;
  p->vClasses2->nSize = 0;
  pVVar7 = p->vClasses;
  if (1 < pVVar7->nSize) {
    lVar14 = 0;
    iVar6 = 0;
    do {
      nSize = pVVar7->pArray[lVar14 + 1];
      uVar8 = (ulong)nSize;
      if ((int)nSize < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,0x137,"int Gia_IsoSort(Gia_IsoMan_t *)");
      }
      Entry = pVVar7->pArray[lVar14];
      pwVar1 = p->pStoreW;
      uVar13 = pwVar1[(int)Entry];
      if ((long)uVar13 < 0) {
LAB_006f52ff:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pGia;
      if (pGVar2->nObjs <= (int)(uVar13 >> 0x20)) goto LAB_006f52ff;
      pGVar12 = pGVar2->pObjs;
      bVar5 = true;
      uVar11 = 0;
      do {
        uVar3 = pwVar1[(long)(int)Entry + uVar11];
        if (((long)uVar3 < 0) || (pGVar2->nObjs <= (int)(uVar3 >> 0x20))) goto LAB_006f52ff;
        *(uint *)(pwVar1 + (long)(int)Entry + uVar11) = pGVar12[uVar3 >> 0x20].Value;
        if (pGVar12[uVar3 >> 0x20].Value != pGVar12[uVar13 >> 0x20].Value) {
          bVar5 = false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
      if (bVar5) {
        Vec_IntPush(p->vClasses2,Entry);
        Vec_IntPush(p->vClasses2,nSize);
      }
      else {
        iVar6 = clock_gettime(3,&local_48);
        if (iVar6 < 0) {
          lVar9 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
          lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_48.tv_sec * -1000000;
        }
        Abc_QuickSort3(p->pStoreW + (int)Entry,nSize,0);
        iVar6 = clock_gettime(3,&local_48);
        if (iVar6 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        p->timeSort = p->timeSort + lVar10 + lVar9;
        uVar13 = p->pStoreW[(int)Entry];
        if ((long)uVar13 < 0) goto LAB_006f52ff;
        if (p->pGia->nObjs <= (int)(uVar13 >> 0x20)) goto LAB_006f52ff;
        pGVar12 = p->pGia->pObjs + (uVar13 >> 0x20);
        if ((int)nSize < 3) {
          uVar8 = 2;
        }
        lVar9 = 0;
        uVar13 = (ulong)Entry;
        do {
          uVar11 = p->pStoreW[(long)(int)Entry + lVar9 + 1];
          if ((long)uVar11 < 0) goto LAB_006f52ff;
          if (p->pGia->nObjs <= (int)(uVar11 >> 0x20)) goto LAB_006f52ff;
          pGVar4 = p->pGia->pObjs;
          if (pGVar12->Value != pGVar4[uVar11 >> 0x20].Value) {
            pGVar12 = pGVar4 + (uVar11 >> 0x20);
            Entry_00 = (int)uVar13;
            iVar6 = Entry + (int)lVar9;
            uVar13 = (ulong)Entry + lVar9 + 1;
            if (iVar6 == Entry_00) {
              uVar11 = p->pStoreW[Entry_00] >> 0x20;
              if (p->pUniques[uVar11] != 0) {
                __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                              ,0x157,"int Gia_IsoSort(Gia_IsoMan_t *)");
              }
              iVar6 = p->nUniques;
              p->nUniques = iVar6 + 1;
              p->pUniques[uVar11] = iVar6;
              p->nSingles = p->nSingles + 1;
              uVar13 = uVar13 & 0xffffffff;
            }
            else {
              local_38 = uVar13;
              Vec_IntPush(p->vClasses2,Entry_00);
              Vec_IntPush(p->vClasses2,(iVar6 - Entry_00) + 1);
              uVar13 = local_38 & 0xffffffff;
            }
          }
          lVar9 = lVar9 + 1;
        } while (uVar8 - 1 != lVar9);
        iVar6 = (int)uVar13;
        if ((int)lVar9 + (Entry - iVar6) == 0) {
          uVar8 = p->pStoreW[iVar6] >> 0x20;
          if (p->pUniques[uVar8] != 0) {
            __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                          ,0x167,"int Gia_IsoSort(Gia_IsoMan_t *)");
          }
          iVar6 = p->nUniques;
          p->nUniques = iVar6 + 1;
          p->pUniques[uVar8] = iVar6;
          p->nSingles = p->nSingles + 1;
          iVar6 = 1;
        }
        else {
          Vec_IntPush(p->vClasses2,iVar6);
          Vec_IntPush(p->vClasses2,(int)lVar9 + (Entry - iVar6) + 1);
          iVar6 = 1;
        }
      }
      lVar14 = lVar14 + 2;
      pVVar7 = p->vClasses;
    } while ((int)((uint)lVar14 | 1) < pVVar7->nSize);
  }
  p->vClasses = p->vClasses2;
  p->vClasses2 = pVVar7;
  p->nEntries = p->nEntries - p->nSingles;
  return iVar6;
}

Assistant:

int Gia_IsoSort( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj, * pObj0;
    int i, k, fSameValue, iBegin, iBeginOld, nSize, nSizeNew;
    int fRefined = 0;
    abctime clk;

    // go through the equiv classes
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        assert( nSize > 1 );
        fSameValue = 1;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            Gia_IsoSetValue( p, iBegin+k, pObj->Value );
            if ( pObj->Value != pObj0->Value )
                fSameValue = 0;
        }
        if ( fSameValue )
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
            continue;
        }
        fRefined = 1;
        // sort objects
        clk = Abc_Clock();
        Abc_QuickSort3( p->pStoreW + iBegin, nSize, 0 );
        p->timeSort += Abc_Clock() - clk;
        // divide into new classes
        iBeginOld = iBegin;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 1; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( pObj0->Value == pObj->Value )
                continue;
            nSizeNew = iBegin + k - iBeginOld;
            if ( nSizeNew == 1 )
            {
                assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
                p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
                p->nSingles++;
            }
            else
            {
                Vec_IntPush( p->vClasses2, iBeginOld );
                Vec_IntPush( p->vClasses2, nSizeNew );
            }
            iBeginOld = iBegin + k;
            pObj0 = pObj;
        }
        // add the last one
        nSizeNew = iBegin + k - iBeginOld;
        if ( nSizeNew == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBeginOld );
            Vec_IntPush( p->vClasses2, nSizeNew );
        }
    }

    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
    return fRefined;
}